

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O1

void __thiscall Circuit::recompute_map(Circuit *this)

{
  GateType GVar1;
  pointer pGVar2;
  pointer puVar3;
  pointer puVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  pointer *ppuVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  pGVar2 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = (long)(this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pGVar2 >> 2;
  this->num_AND = 0;
  this->total_num_AND = 0;
  iVar12 = (int)uVar13;
  if (iVar12 != 0) {
    uVar6 = this->num_AND;
    uVar7 = this->total_num_AND;
    ppuVar8 = (pointer *)
              ((long)&(((this->GateO).
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data + 8);
    uVar10 = 0;
    do {
      GVar1 = pGVar2[uVar10];
      if (GVar1 == MAND) {
        iVar11 = (int)((ulong)((long)*ppuVar8 -
                              (long)((_Vector_impl_data *)(ppuVar8 + -1))->_M_start) >> 2);
LAB_00104574:
        uVar7 = uVar7 + iVar11;
        this->total_num_AND = uVar7;
      }
      else if (GVar1 == AND) {
        uVar6 = uVar6 + 1;
        this->num_AND = uVar6;
        iVar11 = 1;
        goto LAB_00104574;
      }
      uVar10 = uVar10 + 1;
      ppuVar8 = ppuVar8 + 3;
    } while ((uVar13 & 0xffffffff) != uVar10);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->map,(ulong)this->num_AND);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->imap,uVar13 & 0xffffffff);
  auVar5 = _DAT_00117300;
  if (iVar12 != 0) {
    uVar6 = iVar12 * 2;
    puVar3 = (this->imap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (uVar13 & 0xffffffff) - 1;
    auVar14._8_4_ = (int)lVar9;
    auVar14._0_8_ = lVar9;
    auVar14._12_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar15 = pmovsxbq(in_XMM1,0x302);
    auVar16 = pmovsxbq(in_XMM2,0x100);
    uVar10 = 0;
    auVar14 = auVar14 ^ _DAT_00117300;
    auVar17 = pmovsxbq(in_XMM5,0x404);
    do {
      auVar18 = auVar16 ^ auVar5;
      lVar9 = auVar14._0_8_;
      if ((bool)(~(lVar9 < auVar18._0_8_) & 1)) {
        puVar3[uVar10] = uVar6;
      }
      if (auVar18._8_8_ <= auVar14._8_8_) {
        puVar3[uVar10 + 1] = uVar6;
      }
      if ((long)(auVar15._0_8_ ^ auVar5._0_8_) <= lVar9) {
        puVar3[uVar10 + 2] = uVar6;
        puVar3[uVar10 + 3] = uVar6;
      }
      uVar10 = uVar10 + 4;
      lVar9 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + auVar17._0_8_;
      auVar16._8_8_ = lVar9 + auVar17._8_8_;
      lVar9 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + auVar17._0_8_;
      auVar15._8_8_ = lVar9 + auVar17._8_8_;
    } while (((uVar13 & 0xffffffff) + 3 & 0xfffffffffffffffc) != uVar10);
    pGVar2 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->map).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->imap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    uVar6 = 0;
    do {
      if (pGVar2[uVar10] == AND) {
        puVar3[uVar6] = (uint)uVar10;
        puVar4[uVar10] = uVar6;
        uVar6 = uVar6 + 1;
      }
      uVar10 = uVar10 + 1;
    } while ((uVar13 & 0xffffffff) != uVar10);
  }
  return;
}

Assistant:

void Circuit::recompute_map() {
  unsigned int nG = GateT.size();

  num_AND = 0;
  total_num_AND = 0;
  for (unsigned int i = 0; i < nG; i++) {
    if (GateT[i] == AND) {
      num_AND++;
      total_num_AND++;
    }
    if (GateT[i] == MAND) {
      total_num_AND += GateO[i].size();
    }
  }

  // Define map between AND gates and the actual gates
  map.resize(num_AND);
  imap.resize(nG);

  // Set stupid default value for imap, to be caught in access function
  for (unsigned int i = 0; i < nG; i++) {
    imap[i] = 2 * nG;
  }
  unsigned int cnt = 0;
  for (unsigned int i = 0; i < nG; i++) {
    if (GateT[i] == AND) {
      map[cnt] = i;
      imap[i] = cnt;
      cnt++;
    }
  }
}